

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void * __thiscall ncnn::UnlockedPoolAllocator::fastMalloc(UnlockedPoolAllocator *this,size_t size)

{
  UnlockedPoolAllocatorPrivate *pUVar1;
  _List_node_base *p_Var2;
  int iVar3;
  const_iterator __position;
  const_iterator __position_00;
  const_iterator cVar4;
  _List_node_base *p_Var5;
  value_type local_38;
  
  pUVar1 = this->d;
  __position._M_node =
       (pUVar1->budgets).
       super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  cVar4._M_node = __position._M_node;
  __position_00._M_node = __position._M_node;
  for (; __position._M_node != (_List_node_base *)&pUVar1->budgets;
      __position._M_node = (__position._M_node)->_M_next) {
    p_Var2 = __position._M_node[1]._M_next;
    if ((size <= p_Var2) && ((ulong)pUVar1->size_compare_ratio * (long)p_Var2 >> 8 <= size)) {
      p_Var5 = __position._M_node[1]._M_prev;
      std::__cxx11::
      list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
      erase(&pUVar1->budgets,__position);
      pUVar1 = this->d;
      local_38.first = (unsigned_long)p_Var2;
      goto LAB_00137af2;
    }
    if (__position_00._M_node[1]._M_next < p_Var2) {
      __position_00._M_node = __position._M_node;
    }
    if (p_Var2 < cVar4._M_node[1]._M_next) {
      cVar4._M_node = __position._M_node;
    }
  }
  if (pUVar1->size_drop_threshold <=
      (pUVar1->budgets).
      super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
      ._M_impl._M_node._M_size) {
    if (__position_00._M_node[1]._M_next < size) {
      free(cVar4._M_node[1]._M_prev);
      pUVar1 = this->d;
      __position_00._M_node = cVar4._M_node;
    }
    else {
      if (cVar4._M_node[1]._M_next <= size) goto LAB_00137ac4;
      free(__position_00._M_node[1]._M_prev);
      pUVar1 = this->d;
    }
    std::__cxx11::
    list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
    erase(&pUVar1->budgets,__position_00);
  }
LAB_00137ac4:
  local_38.first = 0;
  iVar3 = posix_memalign((void **)&local_38,0x40,size + 0x40);
  if (iVar3 != 0) {
    local_38.first = 0;
  }
  pUVar1 = this->d;
  p_Var5 = (_List_node_base *)local_38.first;
  local_38.first = size;
LAB_00137af2:
  local_38.second = p_Var5;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(&pUVar1->payouts,&local_38);
  return p_Var5;
}

Assistant:

void* UnlockedPoolAllocator::fastMalloc(size_t size)
{
    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin(), it_max = d->budgets.begin(), it_min = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->payouts.push_back(std::make_pair(bs, ptr));

            return ptr;
        }

        if (bs > it_max->first)
        {
            it_max = it;
        }
        if (bs < it_min->first)
        {
            it_min = it;
        }
    }

    if (d->budgets.size() >= d->size_drop_threshold)
    {
        if (it_max->first < size)
        {
            ncnn::fastFree(it_min->second);
            d->budgets.erase(it_min);
        }
        else if (it_min->first > size)
        {
            ncnn::fastFree(it_max->second);
            d->budgets.erase(it_max);
        }
    }

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts.push_back(std::make_pair(size, ptr));

    return ptr;
}